

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyGuard.h
# Opt level: O0

FakePropertyGuardWeakReference *
Js::FakePropertyGuardWeakReference::New(Recycler *recycler,PropertyGuard *guard)

{
  code *pcVar1;
  PropertyGuard *this;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  FakePropertyGuardWeakReference *this_00;
  TrackAllocData local_40;
  PropertyGuard *local_18;
  PropertyGuard *guard_local;
  Recycler *recycler_local;
  
  local_18 = guard;
  guard_local = (PropertyGuard *)recycler;
  if (guard == (PropertyGuard *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/PropertyGuard.h"
                                ,0x87,"(guard != nullptr)","guard != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = guard_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/PropertyGuard.h"
             ,0x88);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this,&local_40);
  this_00 = (FakePropertyGuardWeakReference *)new<Memory::Recycler>(0x28,alloc,0xa38830);
  FakePropertyGuardWeakReference(this_00,local_18);
  return this_00;
}

Assistant:

static FakePropertyGuardWeakReference* New(Recycler* recycler, Js::PropertyGuard* guard)
    {
        Assert(guard != nullptr);
        return RecyclerNewLeaf(recycler, Js::FakePropertyGuardWeakReference, guard);
    }